

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O3

void FreeDicoTree(s_assenv *ae)

{
  s_crcdico_tree *lt;
  long lVar1;
  
  lVar1 = 0;
  do {
    lt = (ae->dicotree).radix[lVar1];
    if (lt != (s_crcdico_tree *)0x0) {
      FreeDicoTreeRecurse(lt);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  if ((ae->dicotree).mdico != 0) {
    free((ae->dicotree).dico);
    return;
  }
  return;
}

Assistant:

void FreeDicoTree(struct s_assenv *ae)
{
	#undef FUNC
	#define FUNC "FreeDicoTree"

	int i;

	for (i=0;i<256;i++) {
		if (ae->dicotree.radix[i]) {
			FreeDicoTreeRecurse(ae->dicotree.radix[i]);
		}
	}
	if (ae->dicotree.mdico) MemFree(ae->dicotree.dico);
}